

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O1

void __thiscall
QtPrivate::QMovableArrayOps<ClassInfoDef>::emplace<ClassInfoDef_const&>
          (QMovableArrayOps<ClassInfoDef> *this,qsizetype i,ClassInfoDef *args)

{
  ClassInfoDef **ppCVar1;
  ClassInfoDef *pCVar2;
  Data *pDVar3;
  long lVar4;
  Data *pDVar5;
  char *pcVar6;
  qsizetype qVar7;
  Data *pDVar8;
  char *pcVar9;
  qsizetype qVar10;
  ClassInfoDef *pCVar11;
  qsizetype *pqVar12;
  bool bVar13;
  
  pDVar3 = (this->super_QGenericArrayOps<ClassInfoDef>).super_QArrayDataPointer<ClassInfoDef>.d;
  if ((pDVar3 != (Data *)0x0) &&
     ((__int_type)(pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int> < 2)) {
    lVar4 = (this->super_QGenericArrayOps<ClassInfoDef>).super_QArrayDataPointer<ClassInfoDef>.size;
    if ((lVar4 == i && pDVar3 != (Data *)0x0) &&
       ((pDVar3->super_QArrayData).alloc - lVar4 !=
        ((long)((long)(this->super_QGenericArrayOps<ClassInfoDef>).
                      super_QArrayDataPointer<ClassInfoDef>.ptr -
               ((ulong)((long)&pDVar3[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0)) >> 4) *
        -0x5555555555555555)) {
      pCVar11 = (this->super_QGenericArrayOps<ClassInfoDef>).super_QArrayDataPointer<ClassInfoDef>.
                ptr;
      pDVar5 = (args->name).d.d;
      pCVar11[lVar4].name.d.d = pDVar5;
      pCVar11[lVar4].name.d.ptr = (args->name).d.ptr;
      pCVar11[lVar4].name.d.size = (args->name).d.size;
      if (pDVar5 != (Data *)0x0) {
        LOCK();
        (pDVar5->super_QArrayData).ref_._q_value.super___atomic_base<int> =
             (__atomic_base<int>)
             ((__int_type)(pDVar5->super_QArrayData).ref_._q_value.super___atomic_base<int> + 1);
        UNLOCK();
      }
      pDVar5 = (args->value).d.d;
      pCVar11[lVar4].value.d.d = pDVar5;
      pCVar11[lVar4].value.d.ptr = (args->value).d.ptr;
      pCVar11[lVar4].value.d.size = (args->value).d.size;
      if (pDVar5 != (Data *)0x0) {
        LOCK();
        (pDVar5->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             (pDVar5->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      goto LAB_0012d9fc;
    }
    if (((i == 0) && (pDVar3 != (Data *)0x0)) &&
       ((ClassInfoDef *)((ulong)((long)&pDVar3[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0)
        != (this->super_QGenericArrayOps<ClassInfoDef>).super_QArrayDataPointer<ClassInfoDef>.ptr))
    {
      pCVar11 = (this->super_QGenericArrayOps<ClassInfoDef>).super_QArrayDataPointer<ClassInfoDef>.
                ptr;
      pDVar5 = (args->name).d.d;
      pCVar11[-1].name.d.d = pDVar5;
      pCVar11[-1].name.d.ptr = (args->name).d.ptr;
      pCVar11[-1].name.d.size = (args->name).d.size;
      if (pDVar5 != (Data *)0x0) {
        LOCK();
        (pDVar5->super_QArrayData).ref_._q_value.super___atomic_base<int> =
             (__atomic_base<int>)
             ((__int_type)(pDVar5->super_QArrayData).ref_._q_value.super___atomic_base<int> + 1);
        UNLOCK();
      }
      pDVar5 = (args->value).d.d;
      pCVar11[-1].value.d.d = pDVar5;
      pCVar11[-1].value.d.ptr = (args->value).d.ptr;
      pCVar11[-1].value.d.size = (args->value).d.size;
      if (pDVar5 != (Data *)0x0) {
        LOCK();
        (pDVar5->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             (pDVar5->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      ppCVar1 = &(this->super_QGenericArrayOps<ClassInfoDef>).super_QArrayDataPointer<ClassInfoDef>.
                 ptr;
      *ppCVar1 = *ppCVar1 + -1;
      goto LAB_0012d9fc;
    }
  }
  pDVar5 = (args->name).d.d;
  pcVar6 = (args->name).d.ptr;
  qVar7 = (args->name).d.size;
  if (pDVar5 != (Data *)0x0) {
    LOCK();
    (pDVar5->super_QArrayData).ref_._q_value.super___atomic_base<int> =
         (__atomic_base<int>)
         ((__int_type)(pDVar5->super_QArrayData).ref_._q_value.super___atomic_base<int> + 1);
    UNLOCK();
  }
  pDVar8 = (args->value).d.d;
  pcVar9 = (args->value).d.ptr;
  qVar10 = (args->value).d.size;
  if (pDVar8 != (Data *)0x0) {
    LOCK();
    (pDVar8->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         (pDVar8->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  bVar13 = (this->super_QGenericArrayOps<ClassInfoDef>).super_QArrayDataPointer<ClassInfoDef>.size
           != 0;
  QArrayDataPointer<ClassInfoDef>::detachAndGrow
            ((QArrayDataPointer<ClassInfoDef> *)this,(uint)(i == 0 && bVar13),1,(ClassInfoDef **)0x0
             ,(QArrayDataPointer<ClassInfoDef> *)0x0);
  pCVar11 = (this->super_QGenericArrayOps<ClassInfoDef>).super_QArrayDataPointer<ClassInfoDef>.ptr;
  if (i == 0 && bVar13) {
    pCVar11[-1].name.d.d = pDVar5;
    pCVar11[-1].name.d.ptr = pcVar6;
    pCVar11[-1].name.d.size = qVar7;
    pCVar11[-1].value.d.d = pDVar8;
    pCVar11[-1].value.d.ptr = pcVar9;
    pCVar11[-1].value.d.size = qVar10;
    (this->super_QGenericArrayOps<ClassInfoDef>).super_QArrayDataPointer<ClassInfoDef>.ptr =
         pCVar11 + -1;
  }
  else {
    pCVar2 = pCVar11 + i;
    memmove(pCVar2 + 1,pCVar11 + i,
            ((this->super_QGenericArrayOps<ClassInfoDef>).super_QArrayDataPointer<ClassInfoDef>.size
            - i) * 0x30);
    (pCVar2->name).d.d = pDVar5;
    (pCVar2->name).d.ptr = pcVar6;
    (pCVar2->name).d.size = qVar7;
    (pCVar2->value).d.d = pDVar8;
    (pCVar2->value).d.ptr = pcVar9;
    (pCVar2->value).d.size = qVar10;
  }
LAB_0012d9fc:
  pqVar12 = &(this->super_QGenericArrayOps<ClassInfoDef>).super_QArrayDataPointer<ClassInfoDef>.size
  ;
  *pqVar12 = *pqVar12 + 1;
  return;
}

Assistant:

void emplace(qsizetype i, Args &&... args)
    {
        bool detach = this->needsDetach();
        if (!detach) {
            if (i == this->size && this->freeSpaceAtEnd()) {
                new (this->end()) T(std::forward<Args>(args)...);
                ++this->size;
                return;
            }
            if (i == 0 && this->freeSpaceAtBegin()) {
                new (this->begin() - 1) T(std::forward<Args>(args)...);
                --this->ptr;
                ++this->size;
                return;
            }
        }
        T tmp(std::forward<Args>(args)...);
        const bool growsAtBegin = this->size != 0 && i == 0;
        const auto pos = growsAtBegin ? Data::GrowsAtBeginning : Data::GrowsAtEnd;

        this->detachAndGrow(pos, 1, nullptr, nullptr);
        if (growsAtBegin) {
            Q_ASSERT(this->freeSpaceAtBegin());
            new (this->begin() - 1) T(std::move(tmp));
            --this->ptr;
            ++this->size;
        } else {
            Inserter(this, i, 1).insertOne(std::move(tmp));
        }
    }